

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O0

Gia_Man_t * Bmcs_ManUnfold(Bmcs_Man_t *p,int f,int nFramesAdd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  int *piVar6;
  Gia_Man_t *pGVar7;
  Gia_Obj_t *pGVar8;
  bool bVar9;
  bool bVar10;
  int nFrameObjs;
  int *pCopies;
  int fTrivial;
  int iLitClean;
  int iLitFrame;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nFramesAdd_local;
  int f_local;
  Bmcs_Man_t *p_local;
  
  bVar10 = true;
  iVar1 = Gia_ManObjNum(p->pFrames);
  iVar2 = Gia_ManPoNum(p->pFrames);
  iVar3 = Gia_ManPoNum(p->pGia);
  if (iVar2 != f * iVar3) {
    __assert_fail("Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x1f0,"Gia_Man_t *Bmcs_ManUnfold(Bmcs_Man_t *, int, int)");
  }
  iLitClean = 0;
  while( true ) {
    if (nFramesAdd <= iLitClean) {
      if (bVar10) {
        p_local = (Bmcs_Man_t *)0x0;
      }
      else {
        iVar2 = Gia_ManObjNum(p->pFrames);
        Vec_IntFillExtra(&p->vFr2Sat,iVar2,-1);
        pGVar7 = p->pFrames;
        iVar2 = Gia_ManObjNum(p->pFrames);
        Vec_IntFillExtra(&pGVar7->vCopies,iVar2,-1);
        Gia_ManStopP(&p->pClean);
        iVar2 = Gia_ManObjNum(p->pFrames);
        pGVar7 = Gia_ManStart((iVar2 - iVar1) + 1000);
        p->pClean = pGVar7;
        Gia_ObjSetCopyArray(p->pFrames,0,0);
        for (iLitClean = 0; iLitClean < nFramesAdd; iLitClean = iLitClean + 1) {
          for (iLitFrame = 0; iVar1 = Gia_ManPoNum(p->pGia), iLitFrame < iVar1;
              iLitFrame = iLitFrame + 1) {
            pGVar7 = p->pFrames;
            iVar1 = Gia_ManPoNum(p->pGia);
            _k = Gia_ManCo(pGVar7,(f + iLitClean) * iVar1 + iLitFrame);
            iVar1 = Gia_ObjFaninId0p(p->pFrames,_k);
            iVar1 = Bmcs_ManCollect_rec(p,iVar1);
            iVar2 = Gia_ObjFaninC0(_k);
            iVar1 = Abc_LitNotCond(iVar1,iVar2);
            iVar1 = Gia_ManAppendCo(p->pClean,iVar1);
            uVar5 = Gia_ObjId(p->pFrames,_k);
            pGVar7 = p->pClean;
            iVar2 = Abc_Lit2Var(iVar1);
            pGVar8 = Gia_ManObj(pGVar7,iVar2);
            pGVar8->Value = uVar5;
            pGVar7 = p->pFrames;
            iVar2 = Gia_ObjId(p->pFrames,_k);
            Gia_ObjSetCopyArray(pGVar7,iVar2,iVar1);
          }
        }
        p_local = (Bmcs_Man_t *)p->pClean;
        p->pClean = (Gia_Man_t *)0x0;
        iLitFrame = 0;
        while( true ) {
          bVar10 = false;
          if (iLitFrame < ((Gia_Man_t *)p_local)->nObjs) {
            _k = Gia_ManObj((Gia_Man_t *)p_local,iLitFrame);
            bVar10 = _k != (Gia_Obj_t *)0x0;
          }
          if (!bVar10) break;
          Gia_ObjSetCopyArray(p->pFrames,_k->Value,-1);
          iLitFrame = iLitFrame + 1;
        }
      }
      return (Gia_Man_t *)p_local;
    }
    iVar2 = Gia_ManObjNum(p->pGia);
    __s = malloc((long)iVar2 << 2);
    iVar2 = Gia_ManObjNum(p->pGia);
    memset(__s,0xff,(long)iVar2 << 2);
    Vec_PtrPush(&p->vGia2Fr,__s);
    iVar2 = Vec_PtrSize(&p->vGia2Fr);
    if (iVar2 != f + iLitClean + 1) break;
    piVar6 = Bmcs_ManCopies(p,f + iLitClean);
    *piVar6 = 0;
    iLitFrame = 0;
    while( true ) {
      iVar2 = Gia_ManPoNum(p->pGia);
      bVar9 = false;
      if (iLitFrame < iVar2) {
        _k = Gia_ManCo(p->pGia,iLitFrame);
        bVar9 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar2 = Gia_ObjFaninId0p(p->pGia,_k);
      iVar2 = Bmcs_ManUnfold_rec(p,iVar2,f + iLitClean);
      iVar3 = Gia_ObjFaninC0(_k);
      iVar2 = Abc_LitNotCond(iVar2,iVar3);
      iVar3 = Gia_ManAppendCo(p->pFrames,iVar2);
      iVar4 = Gia_ObjId(p->pGia,_k);
      piVar6[iVar4] = iVar3;
      bVar10 = (bool)(iVar2 == 0 & bVar10);
      iLitFrame = iLitFrame + 1;
    }
    iLitClean = iLitClean + 1;
  }
  __assert_fail("Vec_PtrSize(&p->vGia2Fr) == f+k+1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                ,0x1f5,"Gia_Man_t *Bmcs_ManUnfold(Bmcs_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Bmcs_ManUnfold( Bmcs_Man_t * p, int f, int nFramesAdd )
{
    Gia_Man_t * pNew = NULL; Gia_Obj_t * pObj;
    int i, k, iLitFrame, iLitClean, fTrivial = 1;
    int * pCopies, nFrameObjs = Gia_ManObjNum(p->pFrames);
    assert( Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia) );
    for ( k = 0; k < nFramesAdd; k++ )
    {
        // unfold this timeframe
        Vec_PtrPush( &p->vGia2Fr, ABC_FALLOC(int, Gia_ManObjNum(p->pGia)) );
        assert( Vec_PtrSize(&p->vGia2Fr) == f+k+1 );
        pCopies = Bmcs_ManCopies( p, f+k );
        //memset( pCopies, 0xFF, sizeof(int)*Gia_ManObjNum(p->pGia) );  
        pCopies[0] = 0;
        Gia_ManForEachPo( p->pGia, pObj, i )
        {
            iLitFrame = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f+k );
            iLitFrame = Abc_LitNotCond( iLitFrame, Gia_ObjFaninC0(pObj) );
            pCopies[Gia_ObjId(p->pGia, pObj)] = Gia_ManAppendCo( p->pFrames, iLitFrame );
            fTrivial &= (iLitFrame == 0);
        }
    }
    if ( fTrivial )
        return NULL;
    // create a clean copy of the new nodes of this timeframe
    Vec_IntFillExtra( &p->vFr2Sat, Gia_ManObjNum(p->pFrames), -1 );
    Vec_IntFillExtra( &p->pFrames->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    //assert( Vec_IntCountEntry(&p->pFrames->vCopies, -1) == Vec_IntSize(&p->pFrames->vCopies) );
    Gia_ManStopP( &p->pClean );
    p->pClean = Gia_ManStart( Gia_ManObjNum(p->pFrames) - nFrameObjs + 1000 );
    Gia_ObjSetCopyArray( p->pFrames, 0, 0 );
    for ( k = 0; k < nFramesAdd; k++ )
    for ( i = 0; i < Gia_ManPoNum(p->pGia); i++ )
    {
        pObj = Gia_ManCo( p->pFrames, (f+k) * Gia_ManPoNum(p->pGia) + i );
        iLitClean = Bmcs_ManCollect_rec( p, Gia_ObjFaninId0p(p->pFrames, pObj) );
        iLitClean = Abc_LitNotCond( iLitClean, Gia_ObjFaninC0(pObj) );
        iLitClean = Gia_ManAppendCo( p->pClean, iLitClean );
        Gia_ManObj( p->pClean, Abc_Lit2Var(iLitClean) )->Value = Gia_ObjId(p->pFrames, pObj);
        Gia_ObjSetCopyArray( p->pFrames, Gia_ObjId(p->pFrames, pObj), iLitClean );
    }
    pNew = p->pClean; p->pClean = NULL;
    Gia_ManForEachObj( pNew, pObj, i )
        Gia_ObjSetCopyArray( p->pFrames, pObj->Value, -1 );
    return pNew;
}